

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtaskqueue.h
# Opt level: O1

bool __thiscall
TaskQueue<std::shared_ptr<RenderTask>_>::pop
          (TaskQueue<std::shared_ptr<RenderTask>_> *this,shared_ptr<RenderTask> *task)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Elt_pointer psVar3;
  bool bVar4;
  bool bVar5;
  lock_t lock;
  unique_lock<std::mutex> local_38;
  
  local_38._M_device = &this->_mutex;
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  psVar3 = (this->_q).
           super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  bVar4 = (this->_q).
          super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur == psVar3;
  bVar5 = !bVar4;
  if (bVar4) {
    if (this->_done == false) {
      do {
        std::condition_variable::wait((unique_lock *)&this->_ready);
        psVar3 = (this->_q).
                 super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        bVar5 = (this->_q).
                super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur != psVar3;
        if (bVar5) goto LAB_0013ea94;
      } while (this->_done == false);
    }
    if (bVar5 == false) goto LAB_0013eab7;
  }
LAB_0013ea94:
  peVar1 = (psVar3->super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (psVar3->super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (psVar3->super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (psVar3->super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (task->super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (task->super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar1;
  (task->super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::deque<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>::pop_front
            (&this->_q);
LAB_0013eab7:
  if (local_38._M_owns == true) {
    std::unique_lock<std::mutex>::unlock(&local_38);
  }
  return bVar5;
}

Assistant:

bool pop(Task &task)
    {
        lock_t lock{_mutex};
        while (_q.empty() && !_done) _ready.wait(lock);
        if (_q.empty()) return false;
        task = std::move(_q.front());
        _q.pop_front();
        return true;
    }